

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::RoundLog2(int x,int tile_rounding_mode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if (tile_rounding_mode == 0) {
    if (1 < (uint)x) {
      iVar2 = 0;
      do {
        iVar2 = iVar2 + 1;
        bVar1 = 3 < (uint)x;
        x = (uint)x >> 1;
      } while (bVar1);
      return iVar2;
    }
  }
  else if (1 < (uint)x) {
    iVar2 = 0;
    iVar3 = 0;
    do {
      if ((x & 1U) != 0) {
        iVar2 = 1;
      }
      iVar3 = iVar3 + 1;
      bVar1 = 3 < (uint)x;
      x = (uint)x >> 1;
    } while (bVar1);
    return iVar2 + iVar3;
  }
  return 0;
}

Assistant:

static int RoundLog2(int x, int tile_rounding_mode) {
  return (tile_rounding_mode == TINYEXR_TILE_ROUND_DOWN) ? FloorLog2(static_cast<unsigned>(x)) : CeilLog2(static_cast<unsigned>(x));
}